

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# osgen3.c
# Opt level: O0

void osgen_draw_sb_mode_line(void)

{
  osgen_txtwin_t *poVar1;
  int top;
  int oss_color;
  osgen_txtwin_t *win;
  int in_stack_00000018;
  int in_stack_0000001c;
  int in_stack_00000020;
  char *in_stack_00000058;
  int in_stack_00000064;
  int in_stack_00000068;
  int in_stack_0000006c;
  osgen_win_t *in_stack_00000070;
  int in_stack_ffffffffffffffe8;
  int in_stack_ffffffffffffffec;
  int in_stack_fffffffffffffff0;
  
  poVar1 = S_sbmode_win;
  if (S_sbmode_win != (osgen_txtwin_t *)0x0) {
    top = ossgetcolor(in_stack_00000020,in_stack_0000001c,in_stack_00000018,win._4_4_);
    ossclr(top,in_stack_fffffffffffffff0,in_stack_ffffffffffffffec,in_stack_ffffffffffffffe8,0);
    (poVar1->base).winy = (poVar1->base).winy + -1;
    (poVar1->base).ht = (poVar1->base).ht + 1;
    osgen_disp_trunc(in_stack_00000070,in_stack_0000006c,in_stack_00000068,in_stack_00000064,
                     in_stack_00000058);
    (poVar1->base).winy = (poVar1->base).winy + 1;
    (poVar1->base).ht = (poVar1->base).ht - 1;
  }
  return;
}

Assistant:

static void osgen_draw_sb_mode_line(void)
{
    osgen_txtwin_t *win;
    int oss_color;

    /* get the current scrollback window */
    win = S_sbmode_win;

    /* there's nothing to do if there's no scrollback window */
    if (win == 0)
        return;

    /* get the color - use the reverse of the window's current color scheme */
    oss_color = ossgetcolor(win->base.fillcolor, win->base.txtfg, 0,
                            OSGEN_COLOR_TRANSPARENT);

    /* clear the area of the mode line */
    ossclr(win->base.winy - 1, win->base.winx,
           win->base.winy - 1, win->base.winx + win->base.wid - 1, oss_color);

    /* momentarily bring the mode line back into the window's area */
    win->base.winy -= 1;
    win->base.ht += 1;

    /* draw the mode line text */
    osgen_disp_trunc(&win->base, 0, 0, oss_color, OS_SBSTAT);

    /* undo our temporary adjustment of the window size */
    win->base.winy += 1;
    win->base.ht -= 1;
}